

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

void __thiscall
wasm::OrderedFixedStorage<unsigned_int,_3UL>::erase
          (OrderedFixedStorage<unsigned_int,_3UL> *this,uint *x)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (this->super_FixedStorageBase<unsigned_int,_3UL>).used;
  uVar2 = 1;
  while( true ) {
    if (uVar2 - uVar1 == 1) {
      return;
    }
    if ((this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar2 - 1] == *x) break;
    uVar2 = uVar2 + 1;
  }
  for (; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar2 - 1] =
         (this->super_FixedStorageBase<unsigned_int,_3UL>).storage._M_elems[uVar2];
  }
  (this->super_FixedStorageBase<unsigned_int,_3UL>).used = uVar1 - 1;
  return;
}

Assistant:

void erase(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        // We found the item; move things backwards and shrink.
        for (size_t j = i + 1; j < this->used; j++) {
          this->storage[j - 1] = this->storage[j];
        }
        this->used--;
        return;
      }
    }
  }